

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O2

LY_ERR lyd_validate_unres(lyd_node **tree,lys_module *mod,lyd_type data_type,ly_set *node_when,
                         uint32_t when_xp_opts,ly_set *node_types,ly_set *meta_types,
                         ly_set *ext_node,ly_set *ext_val,uint32_t val_opts,lyd_node **diff)

{
  uint uVar1;
  long *plVar2;
  lyd_node *plVar3;
  lysc_node *plVar4;
  lyd_node *ctx_node;
  bool bVar5;
  LY_ERR LVar6;
  uint uVar7;
  LY_ERR LVar8;
  lys_module *plVar9;
  ulong uVar10;
  ly_set *plVar11;
  uint32_t uVar12;
  LY_ERR local_64;
  uint32_t i;
  ly_set *local_58;
  lyd_node **local_50;
  lysc_type *type;
  uint32_t local_3c;
  lys_module *local_38;
  
  local_64 = LY_SUCCESS;
  local_58 = node_types;
  local_50 = tree;
  local_3c = when_xp_opts;
  local_38 = mod;
  if ((ext_val != (ly_set *)0x0) && (uVar12 = ext_val->count, uVar12 != 0)) {
    uVar10 = (ulong)(uVar12 - 1);
    local_64 = LY_SUCCESS;
    do {
      plVar2 = *(long **)(ext_val->field_2).dnodes[uVar10];
      LVar6 = (**(code **)(*(long *)(*plVar2 + 0x18) + 0x40))
                        (plVar2,(ext_val->field_2).dnodes[uVar10]->schema,*local_50,data_type,
                         val_opts,diff);
      if (LVar6 != LY_SUCCESS) {
        if (LVar6 != LY_EVALID) {
          return LVar6;
        }
        local_64 = LY_EVALID;
        if ((val_opts & 4) == 0) {
          return LY_EVALID;
        }
      }
      ly_set_rm_index(ext_val,(uint32_t)uVar10,free);
      uVar10 = uVar10 - 1;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  if ((ext_node != (ly_set *)0x0) && (uVar12 = ext_node->count, uVar12 != 0)) {
    uVar10 = (ulong)(uVar12 - 1);
    do {
      plVar2 = *(long **)(ext_node->field_2).dnodes[uVar10];
      LVar6 = (**(code **)(*(long *)(*plVar2 + 0x18) + 0x30))
                        (plVar2,(ext_node->field_2).dnodes[uVar10]->schema,val_opts);
      if (LVar6 != LY_SUCCESS) {
        if (LVar6 != LY_EVALID) {
          return LVar6;
        }
        local_64 = LY_EVALID;
        if ((val_opts & 4) == 0) {
          return LY_EVALID;
        }
      }
      ly_set_rm_index(ext_node,(uint32_t)uVar10,free);
      uVar10 = uVar10 - 1;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  if (node_when != (ly_set *)0x0) {
    uVar7 = node_when->count;
    do {
      if (uVar7 != 0) {
        i = uVar7;
        LVar6 = LY_SUCCESS;
        do {
          i = i - 1;
          plVar3 = (node_when->field_2).dnodes[i];
          ly_log_location(plVar3->schema,plVar3,(char *)0x0,(ly_in *)0x0);
          LVar8 = lyd_validate_node_when
                            (*local_50,plVar3,plVar3->schema,local_3c,(lysc_when **)&type);
          if (LVar8 != LY_EINCOMPLETE) {
            if (LVar8 == LY_EVALID) {
              LVar8 = LY_EVALID;
              LVar6 = LVar8;
              if ((val_opts & 4) == 0) goto LAB_001a9172;
            }
            else {
              if (LVar8 != LY_SUCCESS) {
LAB_001a9172:
                ly_log_location_revert(1,1,0,0);
                break;
              }
              if (type == (lysc_type *)0x0) {
                plVar3->flags = plVar3->flags | 2;
              }
              else if ((plVar3->flags & 2) == 0) {
                plVar4 = plVar3->schema;
                if ((val_opts & 8) == 0) {
                  if (plVar4 == (lysc_node *)0x0) {
                    plVar9 = (lys_module *)&plVar3[2].schema;
                  }
                  else {
                    plVar9 = plVar4->module;
                  }
                  ly_vlog(plVar9->ctx,(char *)0x0,LYVE_DATA,"When condition \"%s\" not satisfied.",
                          *(undefined8 *)(type->name + 0x28));
                  LVar8 = LY_EVALID;
                  LVar6 = LVar8;
                  if ((val_opts & 4) == 0) goto LAB_001a9172;
                }
                else {
                  if (plVar4 == (lysc_node *)0x0) {
                    plVar9 = (lys_module *)&plVar3[2].schema;
                  }
                  else {
                    plVar9 = plVar4->module;
                  }
                  ly_log(plVar9->ctx,LY_LLWRN,LY_SUCCESS,"When condition \"%s\" not satisfied.",
                         *(undefined8 *)(type->name + 0x28));
                }
              }
              else {
                uVar1 = node_when->count;
                lyd_validate_autodel_node_del
                          (local_50,plVar3,local_38,1,(lyd_node **)0x0,node_when,local_58,diff);
                if (node_when->count < uVar1) {
                  ly_set_contains(node_when,plVar3,&i);
                }
              }
              ly_set_rm_index_ordered(node_when,i,(_func_void_void_ptr *)0x0);
            }
          }
          LVar8 = LVar6;
          ly_log_location_revert(1,1,0,0);
          LVar6 = LVar8;
        } while (i != 0);
        if (LVar8 != LY_SUCCESS) {
          if (LVar8 != LY_EVALID) {
            return LVar8;
          }
          local_64 = LY_EVALID;
          if ((val_opts & 4) == 0) {
            return LY_EVALID;
          }
        }
      }
      uVar1 = node_when->count;
      bVar5 = uVar1 < uVar7;
      uVar7 = uVar1;
    } while (bVar5);
    if (uVar1 != 0) {
      if (((val_opts & 4) == 0) || (local_64 != LY_EVALID)) {
        __assert_fail("!node_when->count || ((rc == LY_EVALID) && (val_opts & LYD_VALIDATE_MULTI_ERROR))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                      ,0x1ee,
                      "LY_ERR lyd_validate_unres(struct lyd_node **, const struct lys_module *, enum lyd_type, struct ly_set *, uint32_t, struct ly_set *, struct ly_set *, struct ly_set *, struct ly_set *, uint32_t, struct lyd_node **)"
                     );
      }
      local_64 = LY_EVALID;
    }
  }
  if ((local_58 != (ly_set *)0x0) && (uVar12 = local_58->count, uVar12 != 0)) {
    uVar10 = (ulong)(uVar12 - 1);
    plVar11 = local_58;
    do {
      plVar3 = (plVar11->field_2).dnodes[uVar10];
      plVar4 = plVar3->schema[1].parent;
      ly_log_location((lysc_node *)0x0,plVar3,(char *)0x0,(ly_in *)0x0);
      if (plVar3->schema == (lysc_node *)0x0) {
        plVar9 = (lys_module *)&plVar3[2].schema;
      }
      else {
        plVar9 = plVar3->schema->module;
      }
      LVar6 = lyd_value_validate_incomplete
                        (plVar9->ctx,(lysc_type *)plVar4,(lyd_value *)(plVar3 + 1),plVar3,*local_50)
      ;
      ly_log_location_revert(0,1,0,0);
      plVar11 = local_58;
      if (LVar6 != LY_SUCCESS) {
        if (LVar6 != LY_EVALID) {
          return LVar6;
        }
        local_64 = LY_EVALID;
        if ((val_opts & 4) == 0) {
          return LY_EVALID;
        }
      }
      ly_set_rm_index(local_58,(uint32_t)uVar10,(_func_void_void_ptr *)0x0);
      uVar10 = uVar10 - 1;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  if ((meta_types != (ly_set *)0x0) && (uVar12 = meta_types->count, uVar12 != 0)) {
    uVar10 = (ulong)(uVar12 - 1);
    do {
      plVar3 = (meta_types->field_2).dnodes[uVar10];
      lyplg_ext_get_storage((lysc_ext_instance *)plVar3->parent,0x2e0000,8,&type);
      ctx_node = *(lyd_node **)plVar3;
      if (ctx_node->schema == (lysc_node *)0x0) {
        plVar9 = (lys_module *)&ctx_node[2].schema;
      }
      else {
        plVar9 = ctx_node->schema->module;
      }
      LVar6 = lyd_value_validate_incomplete
                        (plVar9->ctx,type,(lyd_value *)&plVar3->prev,ctx_node,*local_50);
      if (LVar6 != LY_SUCCESS) {
        if (LVar6 != LY_EVALID) {
          return LVar6;
        }
        local_64 = LY_EVALID;
        if ((val_opts & 4) == 0) {
          return LY_EVALID;
        }
      }
      ly_set_rm_index(meta_types,(uint32_t)uVar10,(_func_void_void_ptr *)0x0);
      uVar10 = uVar10 - 1;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  return local_64;
}

Assistant:

LY_ERR
lyd_validate_unres(struct lyd_node **tree, const struct lys_module *mod, enum lyd_type data_type, struct ly_set *node_when,
        uint32_t when_xp_opts, struct ly_set *node_types, struct ly_set *meta_types, struct ly_set *ext_node,
        struct ly_set *ext_val, uint32_t val_opts, struct lyd_node **diff)
{
    LY_ERR r, rc = LY_SUCCESS;
    uint32_t i;

    if (ext_val && ext_val->count) {
        /* first validate parsed extension data */
        i = ext_val->count;
        do {
            --i;

            struct lyd_ctx_ext_val *ext_v = ext_val->objs[i];

            /* validate extension data */
            r = ext_v->ext->def->plugin->validate(ext_v->ext, ext_v->sibling, *tree, data_type, val_opts, diff);
            LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

            /* remove this item from the set */
            ly_set_rm_index(ext_val, i, free);
        } while (i);
    }

    if (ext_node && ext_node->count) {
        /* validate data nodes with extension instances */
        i = ext_node->count;
        do {
            --i;

            struct lyd_ctx_ext_node *ext_n = ext_node->objs[i];

            /* validate the node */
            r = ext_n->ext->def->plugin->node(ext_n->ext, ext_n->node, val_opts);
            LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

            /* remove this item from the set */
            ly_set_rm_index(ext_node, i, free);
        } while (i);
    }

    if (node_when) {
        /* evaluate all when conditions */
        uint32_t prev_count;

        do {
            prev_count = node_when->count;
            r = lyd_validate_unres_when(tree, mod, node_when, val_opts, when_xp_opts, node_types, diff);
            LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

            /* there must have been some when conditions resolved */
        } while (prev_count > node_when->count);

        /* there could have been no cyclic when dependencies, checked during compilation */
        assert(!node_when->count || ((rc == LY_EVALID) && (val_opts & LYD_VALIDATE_MULTI_ERROR)));
    }

    if (node_types && node_types->count) {
        /* finish incompletely validated terminal values (traverse from the end for efficient set removal) */
        i = node_types->count;
        do {
            --i;

            struct lyd_node_term *node = node_types->objs[i];
            struct lysc_type *type = ((struct lysc_node_leaf *)node->schema)->type;

            /* resolve the value of the node */
            LOG_LOCSET(NULL, &node->node);
            r = lyd_value_validate_incomplete(LYD_CTX(node), type, &node->value, &node->node, *tree);
            LOG_LOCBACK(0, 1);
            LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

            /* remove this node from the set */
            ly_set_rm_index(node_types, i, NULL);
        } while (i);
    }

    if (meta_types && meta_types->count) {
        /* ... and metadata values */
        i = meta_types->count;
        do {
            --i;

            struct lyd_meta *meta = meta_types->objs[i];
            struct lysc_type *type;

            /* validate and store the value of the metadata */
            lyplg_ext_get_storage(meta->annotation, LY_STMT_TYPE, sizeof type, (const void **)&type);
            r = lyd_value_validate_incomplete(LYD_CTX(meta->parent), type, &meta->value, meta->parent, *tree);
            LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

            /* remove this attr from the set */
            ly_set_rm_index(meta_types, i, NULL);
        } while (i);
    }

cleanup:
    return rc;
}